

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O0

void __thiscall
duckdb::roaring::RoaringCompressState::CreateEmptySegment
          (RoaringCompressState *this,idx_t row_start)

{
  BlockManager *other;
  BufferManager *pBVar1;
  pointer pCVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  long in_RDI;
  idx_t in_stack_00000018;
  idx_t in_stack_00000020;
  LogicalType *in_stack_00000028;
  CompressionFunction *in_stack_00000030;
  DatabaseInstance *in_stack_00000038;
  BlockManager *in_stack_00000050;
  BufferManager *buffer_manager;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
  compressed_segment;
  LogicalType *type;
  DatabaseInstance *db;
  BufferHandle *in_stack_ffffffffffffff20;
  undefined1 local_58 [40];
  BufferManager *local_30;
  LogicalType *local_20;
  DatabaseInstance *local_18;
  
  local_18 = ColumnDataCheckpointData::GetDatabase((ColumnDataCheckpointData *)0xa06c10);
  local_20 = ColumnDataCheckpointData::GetType((ColumnDataCheckpointData *)0xa06c2c);
  CompressionInfo::GetBlockSize((CompressionInfo *)0xa06c7a);
  other = CompressionInfo::GetBlockManager((CompressionInfo *)(in_RDI + 8));
  ColumnSegment::CreateTransientSegment
            (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
             in_stack_00000018,in_stack_00000050);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator=
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             in_stack_ffffffffffffff20,
             (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             other);
  pBVar1 = BufferManager::GetBufferManager((DatabaseInstance *)0xa06ce6);
  local_30 = pBVar1;
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_ffffffffffffff20);
  (*pBVar1->_vptr_BufferManager[7])(local_58,pBVar1,&pCVar2->block);
  BufferHandle::operator=(in_stack_ffffffffffffff20,(BufferHandle *)other);
  BufferHandle::~BufferHandle(in_stack_ffffffffffffff20);
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0xa06d80);
  *(data_ptr_t *)(in_RDI + 0x460) = pdVar3;
  *(long *)(in_RDI + 0x460) = *(long *)(in_RDI + 0x460) + 8;
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0xa06db6);
  iVar4 = CompressionInfo::GetBlockSize((CompressionInfo *)0xa06dcb);
  *(data_ptr_t *)(in_RDI + 0x468) = pdVar3 + iVar4;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xa06df8);
  return;
}

Assistant:

void RoaringCompressState::CreateEmptySegment(idx_t row_start) {
	auto &db = checkpoint_data.GetDatabase();
	auto &type = checkpoint_data.GetType();

	auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start, info.GetBlockSize(),
	                                                                info.GetBlockManager());
	current_segment = std::move(compressed_segment);

	auto &buffer_manager = BufferManager::GetBufferManager(db);
	handle = buffer_manager.Pin(current_segment->block);
	data_ptr = handle.Ptr();
	data_ptr += sizeof(idx_t);
	metadata_ptr = handle.Ptr() + info.GetBlockSize();
}